

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCall
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Call *curr)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  Literal *pLVar4;
  Name NVar5;
  undefined1 local_138 [8];
  Flow flow;
  undefined1 auStack_b8 [8];
  Literals arguments;
  undefined1 local_78 [8];
  Literal target;
  Literals newArguments;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_138,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)auStack_b8);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    NVar5.super_IString.str._M_str = (char *)(curr->target).super_IString.str._M_len;
    NVar5.super_IString.str._M_len = (size_t)this->wasm;
    lVar3 = ::wasm::Module::getFunction(NVar5);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    target.type.id = (uintptr_t)(this->super_ExpressionRunner<wasm::ModuleRunner>).module;
    cVar2 = ::wasm::Intrinsics::isCallWithoutEffects((Function *)&target.type);
    if (cVar2 == '\0') {
      if (*(long *)(lVar3 + 0x20) == 0) {
        callFunctionInternal
                  ((Literals *)&target.type,this,(Name)(curr->target).super_IString.str,
                   (Literals *)auStack_b8);
        SmallVector<wasm::Literal,_1UL>::operator=
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                   (SmallVector<wasm::Literal,_1UL> *)&target.type);
      }
      else {
        (*this->externalInterface->_vptr_ExternalInterface[4])
                  (&target.type,this->externalInterface,lVar3,auStack_b8);
        SmallVector<wasm::Literal,_1UL>::operator=
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                   (SmallVector<wasm::Literal,_1UL> *)&target.type);
      }
    }
    else {
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&target.type,
                 (SmallVector<wasm::Literal,_1UL> *)auStack_b8);
      pLVar4 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&target.type);
      ::wasm::Literal::Literal((Literal *)local_78,pLVar4);
      SmallVector<wasm::Literal,_1UL>::pop_back((SmallVector<wasm::Literal,_1UL> *)&target.type);
      NVar5 = Literal::getFunc((Literal *)local_78);
      callFunctionInternal
                ((Literals *)&flow.breakTo.super_IString.str._M_str,this,NVar5,
                 (Literals *)&target.type);
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                 (SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)local_78);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&target.type);
    pcVar1 = _getStruct;
    if (curr->isReturn == true) {
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = RETURN_FLOW;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar1;
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_138);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_138);
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_b8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    auto* func = wasm.getFunction(curr->target);
    Flow ret;
    if (Intrinsics(*self()->getModule()).isCallWithoutEffects(func)) {
      // The call.without.effects intrinsic is a call to an import that actually
      // calls the given function reference that is the final argument.
      auto newArguments = arguments;
      auto target = newArguments.back();
      newArguments.pop_back();
      ret.values = callFunctionInternal(target.getFunc(), newArguments);
    } else if (func->imported()) {
      ret.values = externalInterface->callImport(func, arguments);
    } else {
      ret.values = callFunctionInternal(curr->target, arguments);
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    // TODO: make this a proper tail call (return first)
    if (curr->isReturn) {
      ret.breakTo = RETURN_FLOW;
    }
    return ret;
  }